

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

int ERR_pop_to_mark(void)

{
  uint uVar1;
  ERR_STATE *es_00;
  ERR_STATE *es;
  int in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  int local_4;
  
  es_00 = ossl_err_get_state_int();
  if (es_00 == (ERR_STATE *)0x0) {
    local_4 = 0;
  }
  else {
    while( true ) {
      uVar1 = in_stack_ffffffffffffffec & 0xffffff;
      if (es_00->bottom != es_00->top) {
        uVar1 = CONCAT13(es_00->err_marks[es_00->top] == 0,(int3)in_stack_ffffffffffffffec);
      }
      in_stack_ffffffffffffffec = uVar1;
      if ((char)(in_stack_ffffffffffffffec >> 0x18) == '\0') break;
      err_clear(es_00,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
      if (es_00->top < 1) {
        in_stack_ffffffffffffffe8 = 0xf;
      }
      else {
        in_stack_ffffffffffffffe8 = es_00->top + -1;
      }
      es_00->top = in_stack_ffffffffffffffe8;
    }
    if (es_00->bottom == es_00->top) {
      local_4 = 0;
    }
    else {
      es_00->err_marks[es_00->top] = es_00->err_marks[es_00->top] + -1;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int ERR_pop_to_mark(void)
{
    ERR_STATE *es;

    es = ossl_err_get_state_int();
    if (es == NULL)
        return 0;

    while (es->bottom != es->top
           && es->err_marks[es->top] == 0) {
        err_clear(es, es->top, 0);
        es->top = es->top > 0 ? es->top - 1 : ERR_NUM_ERRORS - 1;
    }

    if (es->bottom == es->top)
        return 0;
    es->err_marks[es->top]--;
    return 1;
}